

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O0

void SourceMap::Add(AutoString *path,AutoString *data)

{
  FileNode *this;
  FileNode *node;
  AutoString *data_local;
  AutoString *path_local;
  
  this = (FileNode *)operator_new(0x48);
  FileNode::FileNode(this,path,data);
  if (root != (FileNode *)0x0) {
    this->next = root;
  }
  root = this;
  return;
}

Assistant:

static void Add(AutoString &path, AutoString &data)
    {
        // SourceMap lifetime == process lifetime
        FileNode * node = new FileNode(path, data);
        if (root != nullptr)
        {
            node->next = root;
        }
        root = node;
    }